

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_fat.c
# Opt level: O0

int ENGINE_set_default_string(ENGINE *e,char *def_list)

{
  int iVar1;
  uint flags;
  undefined4 in_stack_ffffffffffffffe0;
  uint flags_00;
  int local_4;
  
  flags_00 = 0;
  iVar1 = CONF_parse_list(def_list,0x2c,1,int_def_cb,&stack0xffffffffffffffe4);
  if (iVar1 == 0) {
    ERR_new();
    ERR_set_debug((char *)e,(int)((ulong)def_list >> 0x20),
                  (char *)CONCAT44(flags_00,in_stack_ffffffffffffffe0));
    ERR_set_error(0x26,0x96,"str=%s",def_list);
    local_4 = 0;
  }
  else {
    local_4 = ENGINE_set_default(e,flags_00);
  }
  return local_4;
}

Assistant:

int ENGINE_set_default_string(ENGINE *e, const char *def_list)
{
    unsigned int flags = 0;
    if (!CONF_parse_list(def_list, ',', 1, int_def_cb, &flags)) {
        ERR_raise_data(ERR_LIB_ENGINE, ENGINE_R_INVALID_STRING,
                       "str=%s", def_list);
        return 0;
    }
    return ENGINE_set_default(e, flags);
}